

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  filetype_t fVar3;
  int iVar4;
  int iVar5;
  option_t *poVar6;
  char *pcVar7;
  sourcefile_t *psVar8;
  FILE *__filename;
  char *pcVar9;
  FILE *pFVar10;
  FILE *pFVar11;
  char *pcVar12;
  char **opts_1;
  int oset;
  char **opts;
  int del_2;
  char *iname_2;
  int del_1;
  char *oname_1;
  char *iname_1;
  FILE *outfile_1;
  FILE *infile_1;
  int del;
  char *oname;
  char *iname;
  FILE *outfile;
  FILE *infile;
  int donot_link;
  int donot_assemble;
  int donot_compile;
  char *output_name;
  sourcefile_t *file;
  uint in_stack_00000f4c;
  char *in_stack_00000f50;
  char *in_stack_00000f58;
  FILE *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int iVar13;
  uint in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  filetype_t in_stack_ffffffffffffff44;
  FILE *in_stack_ffffffffffffff48;
  _func_void_varargs *in_stack_ffffffffffffff90;
  _func_void_varargs *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  int iVar14;
  FILE *__filename_00;
  int local_4;
  
  iVar14 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  iVar4 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  esetprogram("gbcc");
  esetonfatal(on_fatal_error);
  parse_options(iVar14,(char **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),iVar4,
                in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  iVar4 = errors();
  if (iVar4 == 0) {
    poVar6 = get_option(in_stack_ffffffffffffff38);
    iVar4 = poVar6->set;
    poVar6 = get_option(in_stack_ffffffffffffff38);
    iVar14 = poVar6->set;
    poVar6 = get_option(in_stack_ffffffffffffff38);
    iVar1 = poVar6->set;
    poVar6 = get_option(in_stack_ffffffffffffff38);
    strlen((poVar6->value).str);
    pcVar7 = (char *)mmalloc(CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    pcVar12 = pcVar7;
    poVar6 = get_option(in_stack_ffffffffffffff38);
    strcpy(pcVar12,(poVar6->value).str);
    file_first();
    while (psVar8 = file_next(), psVar8 != (sourcefile_t *)0x0) {
      if (psVar8->type == C) {
        __filename = (FILE *)m_tmpnam();
        iVar13 = psVar8->tmp;
        strlen(psVar8->name);
        pcVar9 = (char *)mmalloc(CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        strcpy(pcVar9,psVar8->name);
        esetfile((char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        pFVar10 = fopen(pcVar9,"rb");
        if (pFVar10 == (FILE *)0x0) {
          ccerr(F,"unable to open \"%s\"",psVar8->name);
        }
        else {
          pFVar11 = fopen((char *)__filename,"wb");
          if (pFVar11 == (FILE *)0x0) {
            fclose(pFVar10);
            ccerr(F,"unable to create output file");
          }
          else {
            iVar5 = pp(pcVar12,in_stack_ffffffffffffff48,
                       (FILE *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            if (iVar5 == 0) {
              fclose(pFVar11);
              __filename_00 = __filename;
            }
            else {
              file_set_attr(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
              fclose(pFVar11);
              if ((iVar4 == 0) || (pcVar7 == (char *)0x0)) {
                __filename_00 = __filename;
                file_name();
                iVar5 = copy_file(in_stack_00000f58,in_stack_00000f50);
                in_stack_ffffffffffffff48 = __filename;
                if (iVar5 == 0) {
                  err(F,"could not write to the output file");
                  in_stack_ffffffffffffff48 = __filename;
                }
              }
              else {
                iVar5 = copy_file(in_stack_00000f58,in_stack_00000f50);
                __filename_00 = __filename;
                if (iVar5 == 0) {
                  err(F,"could not write to the output file");
                  __filename_00 = __filename;
                }
              }
            }
            fclose(pFVar10);
            remove((char *)__filename_00);
            if (iVar13 != 0) {
              remove(pcVar9);
            }
          }
        }
      }
    }
    file_first();
    while( true ) {
      psVar8 = file_next();
      fVar3 = in_stack_ffffffffffffff44 & 0xffffff;
      if (psVar8 != (sourcefile_t *)0x0) {
        fVar3 = CONCAT13(iVar4 != 0,(int3)in_stack_ffffffffffffff44) ^ 0xff000000;
      }
      in_stack_ffffffffffffff44 = fVar3;
      if ((in_stack_ffffffffffffff44 & 0x1000000) == C) break;
      if (psVar8->type == I) {
        pcVar12 = m_tmpnam();
        iVar13 = psVar8->tmp;
        strlen(psVar8->name);
        pcVar9 = (char *)mmalloc(CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        strcpy(pcVar9,psVar8->name);
        esetfile((char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        pFVar10 = fopen(pcVar9,"rb");
        if (pFVar10 == (FILE *)0x0) {
          ccerr(E,"unable to open \"%s\"",psVar8->name);
        }
        else {
          pFVar11 = fopen(pcVar12,"wb");
          if (pFVar11 == (FILE *)0x0) {
            fclose(pFVar10);
            ccerr(E,"unable to create output file");
          }
          else {
            iVar5 = parse((FILE *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff28);
            if (iVar5 == 0) {
              fclose(pFVar11);
            }
            else {
              file_set_attr(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
              fclose(pFVar11);
              if ((iVar14 == 0) || (pcVar7 == (char *)0x0)) {
                in_stack_ffffffffffffff38 = pcVar12;
                file_name();
                iVar5 = copy_file(in_stack_00000f58,in_stack_00000f50);
                if (iVar5 == 0) {
                  err(F,"could not write to the output file");
                }
              }
              else {
                iVar5 = copy_file(in_stack_00000f58,in_stack_00000f50);
                if (iVar5 == 0) {
                  err(F,"could not write to the output file");
                }
              }
            }
            fclose(pFVar10);
            remove(pcVar12);
            if (iVar13 != 0) {
              remove(pcVar9);
            }
          }
        }
      }
    }
    file_first();
    while( true ) {
      psVar8 = file_next();
      uVar2 = in_stack_ffffffffffffff34 & 0xffffff;
      if (psVar8 != (sourcefile_t *)0x0) {
        uVar2 = CONCAT13(iVar14 != 0,(int3)in_stack_ffffffffffffff34) ^ 0xff000000;
      }
      in_stack_ffffffffffffff34 = uVar2;
      if ((in_stack_ffffffffffffff34 & 0x1000000) == 0) break;
      if (psVar8->type == S) {
        iVar4 = psVar8->tmp;
        poVar6 = get_option(in_stack_ffffffffffffff38);
        iVar13 = poVar6->set;
        strlen(psVar8->name);
        pcVar12 = (char *)mmalloc(CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        strcpy(pcVar12,psVar8->name);
        if ((iVar1 == 0) && (iVar5 = file_count(), 1 < iVar5)) {
          poVar6 = get_option(in_stack_ffffffffffffff38);
          poVar6->set = 0;
        }
        gen_options(in_stack_00000f4c);
        if (iVar1 == 0) {
          add_option((char **)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (char *)in_stack_ffffffffffffff28);
        }
        poVar6 = get_option(in_stack_ffffffffffffff38);
        poVar6->set = iVar13;
        add_option((char **)CONCAT44(in_stack_ffffffffffffff34,iVar13),
                   (char *)in_stack_ffffffffffffff28);
        iVar5 = exec(in_stack_ffffffffffffff38,(char **)CONCAT44(in_stack_ffffffffffffff34,iVar13));
        in_stack_ffffffffffffff30 = iVar13;
        if ((iVar5 != 0) &&
           (file_set_attr(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
           in_stack_ffffffffffffff30 = iVar13, iVar4 != 0)) {
          remove(pcVar12);
          in_stack_ffffffffffffff30 = iVar13;
        }
      }
    }
    file_first();
    if ((iVar1 == 0) && (iVar4 = errors(), iVar4 == 0)) {
      gen_options(in_stack_00000f4c);
      while (psVar8 = file_next(), psVar8 != (sourcefile_t *)0x0) {
        add_option((char **)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (char *)in_stack_ffffffffffffff28);
      }
      exec(in_stack_ffffffffffffff38,
           (char **)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    }
    iVar4 = errors();
    if (iVar4 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    sourcefile_t* file = NULL;
    char* output_name = NULL;

    int donot_compile = 0;
    int donot_assemble = 0;
    int donot_link = 0;

    esetprogram(pgm);
    esetonfatal(&on_fatal_error);

    parse_options(argc, argv, GBCC, &help, &version);

    if (errors())
        return EXIT_FAILURE;

    donot_compile = get_option("-E")->set;
    donot_assemble = get_option("-S")->set;
    donot_link = get_option("-c")->set;

    output_name = (char*)mmalloc(strlen(get_option("-o")->value.str) + 1);
    strcpy(output_name, get_option("-o")->value.str);

    /* .c source files */
    file_first();
    while ((file = file_next()) != NULL)
    {
        if (file->type == C)
        {
            FILE* infile = NULL;
            FILE* outfile = NULL;
            char* iname = NULL;
            char* oname = m_tmpnam();
            int   del = file->tmp;

            iname = (char*)mmalloc(strlen(file->name) + 1);
            strcpy(iname, file->name);

            esetfile(file->name);

            /*printf("*** preprocessor in: %s\n", iname);
              printf("*** tmp out: %s\n", oname); */

            if (! (infile = fopen(iname, "rb")) )
            {
                ccerr(F, "unable to open \"%s\"", file->name);
                continue;
            }

            if (! (outfile = fopen(oname, "wb")) )
            {
                fclose(infile);
                ccerr(F, "unable to create output file");
                continue;
            }

            if (pp(iname, infile, outfile))
            {
                /* Update file attributes in the list to get the output
                file name. In case of error the type is not changed and will
                be ignored by further compilation steps. */
                file_set_attr(I, !donot_compile);

                /* Copy the tmp file content to the output file */
                fclose(outfile);
                if (donot_compile && output_name)
                {
                    if (!copy_file(oname, output_name))
                        err(F, "could not write to the output file");
                    /* printf("*** preprocessor out: %s\n\n", file_name()); */
                }
                else
                {
                    if (!copy_file(oname, file_name()))
                        err(F, "could not write to the output file");
                }
            }
            else
                fclose(outfile);

            fclose(infile);
            remove(oname);
            if (del)
                remove(iname);

        }
    }
/*
    file_top();
    printf("\nRemaining files: \n");
    while((file = file_next()) != NULL)
        printf("* %s %s\n", file->name, file->tmp ? "to be removed" : "end product");
    putchar('\n');
*/

    file_first();
    while ((file = file_next()) != NULL && !donot_compile)
    {
        if (file->type == I)
        {
            FILE* infile = NULL;
            FILE* outfile = NULL;
            char* iname = NULL;
            char* oname = m_tmpnam();
            int   del = file->tmp;

            iname = (char*)mmalloc(strlen(file->name) + 1);
            strcpy(iname, file->name);

            esetfile(file->name);

            /* printf("*** parser in: %s\n", iname);
               printf("*** tmp out: %s\n", oname); */

            if (! (infile = fopen(iname, "rb")) )
            {
                ccerr(E, "unable to open \"%s\"", file->name);
                continue;
            }

            if (! (outfile = fopen(oname, "wb")) )
            {
                fclose(infile);
                ccerr(E, "unable to create output file");
                continue;
            }

            if (parse(infile, outfile))
            {
                file_set_attr(S, !donot_assemble);
                fclose(outfile);
                if (donot_assemble && output_name)
                {
                    if (!copy_file(oname, output_name))
                        err(F, "could not write to the output file");
                }
                else
                {
                    if (!copy_file(oname, file_name()))
                        err(F, "could not write to the output file");
                }
            }
            else
                fclose(outfile);

            fclose(infile);
            remove(oname);
            if (del)
                remove(iname);

        }
    }
/*
    file_top();
    printf("\nRemaining files: \n");
    while((file = file_next()) != NULL)
        printf("* %s %s\n", file->name, file->tmp ? "to be removed" : "end product");
*/

    file_first();
    while ((file = file_next()) != NULL && !donot_assemble)
    {
        if (file->type == S)
        {
            char*  iname = NULL;
            int    del = file->tmp;
            char** opts;
            int oset = get_option("-o")->set;

            iname = (char*)mmalloc(strlen(file->name) + 1);
            strcpy(iname, file->name);

            if (!donot_link && file_count() > 1)
                get_option("-o")->set = 0;

            opts = gen_options(GBAS);
            /* We don't want gbas to invoke the linker */
            if (!donot_link)
                opts = add_option(opts, "-c");
            get_option("-o")->set = oset;

            opts = add_option(opts, iname);
            if (exec("gbas", opts))
            {
                file_set_attr(O, 0);
                if (del)
                    remove(iname);
            }
        }
    }

    file_first();
    if (!donot_link && !errors())
    {
        char** opts;
        opts = gen_options(GBAS);
        while ((file = file_next()))
            opts = add_option(opts, file->name);
        exec("gbld", opts);
    }

    if (errors())
        return EXIT_FAILURE;

    return EXIT_SUCCESS;
}